

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Isd.cpp
# Opt level: O1

void __thiscall csm::Nitf21Isd::~Nitf21Isd(Nitf21Isd *this)

{
  ~Nitf21Isd(this);
  operator_delete(this,0xe0);
  return;
}

Assistant:

csm::NitfIsd::~NitfIsd() {}